

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger base_assert(HSQUIRRELVM v)

{
  bool bVar1;
  SQChar *in_RAX;
  SQObjectPtr *o;
  SQInteger SVar2;
  SQRESULT SVar3;
  SQChar *str;
  SQChar *local_18;
  
  local_18 = in_RAX;
  o = SQVM::GetAt(v,v->_stackbase + 1);
  bVar1 = SQVM::IsFalse(o);
  if (bVar1) {
    SVar2 = sq_gettop(v);
    if ((2 < SVar2) && (SVar3 = sq_tostring(v,3), -1 < SVar3)) {
      local_18 = (SQChar *)0x0;
      SVar3 = sq_getstring(v,-1,&local_18);
      if (-1 < SVar3) {
        SVar3 = sq_throwerror(v,local_18);
        return SVar3;
      }
    }
    SVar2 = sq_throwerror(v,"assertion failed");
  }
  else {
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

static SQInteger base_assert(HSQUIRRELVM v)
{
    if(SQVM::IsFalse(stack_get(v,2))){
        SQInteger top = sq_gettop(v);
        if (top>2 && SQ_SUCCEEDED(sq_tostring(v,3))) {
            const SQChar *str = 0;
            if (SQ_SUCCEEDED(sq_getstring(v,-1,&str))) {
                return sq_throwerror(v, str);
            }
        }
        return sq_throwerror(v, _SC("assertion failed"));
    }
    return 0;
}